

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdemon.cpp
# Opt level: O3

int main(void)

{
  ushort uVar1;
  uint uVar2;
  Am_Object *pAVar3;
  ulong uVar4;
  Am_Wrapper *pAVar5;
  undefined8 uVar6;
  Am_Object_Advanced my_adv_obj;
  Am_Object my_win;
  Am_String my_str;
  Am_Object proto_obj;
  Am_Object proto_rect;
  Am_Slot slot;
  Am_Demon_Set my_demons;
  Am_Object my_rect;
  Am_Object my_inter;
  Am_Object rect_2;
  Am_Object_Advanced proto_obj_adv;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  undefined8 local_58;
  Am_Demon_Set local_50 [8];
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  Am_Initialize();
  Am_Object::Create((char *)&local_78);
  Am_Object::operator=(&Foo,&local_78);
  Am_Object::~Am_Object(&local_78);
  Am_Object::Create((char *)&local_60);
  uVar1 = Am_Object::Set((ushort)&local_60,0x66,400);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar1,0x67,400);
  Am_Object::Am_Object(&local_78,pAVar3);
  Am_Object::~Am_Object(&local_60);
  Am_Object::Create((char *)&local_80);
  uVar1 = Am_Object::Set((ushort)&local_80,0x65,10);
  uVar1 = Am_Object::Set(uVar1,100,10);
  uVar1 = Am_Object::Set(uVar1,0x66,100);
  uVar1 = Am_Object::Set(uVar1,0x67,100);
  pAVar3 = (Am_Object *)Am_Object::Add(uVar1,(uint)MY_SLOT,10);
  Am_Object::Am_Object(&local_60,pAVar3);
  Am_Object::~Am_Object(&local_80);
  Am_Object::Am_Object(&local_80,&local_60);
  Am_Object_Advanced::Get_Demons();
  Am_Demon_Set::Copy();
  Am_Demon_Set::~Am_Demon_Set((Am_Demon_Set *)&local_68);
  Am_Object::Get_Prototype();
  Am_Object::Am_Object(&local_10,&local_68);
  Am_Object_Advanced::Get_Demons();
  proto_create = (Am_Object_Demon *)Am_Demon_Set::Get_Object_Demon((Am_Object_Demon_Type)&local_58);
  Am_Demon_Set::~Am_Demon_Set((Am_Demon_Set *)&local_58);
  Am_Demon_Set::Set_Object_Demon((Am_Object_Demon_Type)local_50,(_func_void_Am_Object *)0x0);
  Am_Demon_Set::Set_Slot_Demon((ushort)local_50,(_func_void_Am_Slot *)0x40,0x264c);
  Am_Object_Advanced::Set_Demons((Am_Demon_Set *)&local_80);
  local_58 = Am_Object_Advanced::Get_Slot((ushort)&local_80);
  uVar2 = Am_Slot::Get_Demon_Bits();
  Am_Slot::Set_Demon_Bits((ushort)&local_58);
  if ((uVar2 & 0x40) == 0) {
    uVar4 = Am_Object_Advanced::Get_Default_Demon_Bits();
    if ((uVar4 & 0x40) == 0) {
      Am_Object_Advanced::Set_Default_Demon_Bits((ushort)&local_80);
      Am_Object_Advanced::Get_Demon_Mask();
      Am_Object_Advanced::Set_Demon_Mask((ushort)&local_80);
      Am_Object::Create((char *)&local_48);
      Am_Object::Am_Object(&local_18,&local_78);
      Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_18,0),1);
      Am_Object::~Am_Object(&local_18);
      Am_Object::Create((char *)&local_70);
      pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
      uVar1 = Am_Object::Set((ushort)&local_70,(Am_Wrapper *)0x6a,(ulong)pAVar5);
      pAVar3 = (Am_Object *)Am_Object::Set(uVar1,100,0x1e);
      Am_Object::Am_Object(&local_20,pAVar3);
      Am_Object::~Am_Object(&local_70);
      Am_String::Am_String((Am_String *)&local_70,"Foo is an object!",true);
      Am_Object::Add(0x5240,(Am_String *)(ulong)MY_SLOT,(ulong)&local_70);
      Am_Object::Am_Object(&local_28,&local_48);
      Am_Object::Add_Part((Am_Object_Data *)&local_78,SUB81(&local_28,0),1);
      Am_Object::~Am_Object(&local_28);
      Am_Object::Am_Object(&local_30,&local_20);
      Am_Object::Add_Part((Am_Object_Data *)&local_78,SUB81(&local_30,0),1);
      Am_Object::~Am_Object(&local_30);
      Am_Object::Create((char *)&local_38);
      Am_Object::Am_Object(&local_40,&local_38);
      Am_Object::Add_Part((Am_Object_Data *)&local_78,SUB81(&local_40,0),1);
      Am_Object::~Am_Object(&local_40);
      Am_Main_Event_Loop();
      Am_Cleanup();
      Am_Object::~Am_Object(&local_38);
      Am_String::~Am_String((Am_String *)&local_70);
      Am_Object::~Am_Object(&local_20);
      Am_Object::~Am_Object(&local_48);
      Am_Object::~Am_Object(&local_10);
      Am_Object::~Am_Object(&local_68);
      Am_Demon_Set::~Am_Demon_Set(local_50);
      Am_Object::~Am_Object(&local_80);
      Am_Object::~Am_Object(&local_60);
      Am_Object::~Am_Object(&local_78);
      return 0;
    }
  }
  else {
    Am_Error("duplicate demon bit in slot\n");
  }
  uVar6 = Am_Error("duplicate default demon bit\n");
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_38);
  Am_String::~Am_String((Am_String *)&local_70);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_10);
  Am_Object::~Am_Object(&local_68);
  Am_Demon_Set::~Am_Demon_Set(local_50);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_78);
  _Unwind_Resume(uVar6);
}

Assistant:

int
main(void)
{
  Am_Initialize();

  Foo = Am_Rectangle.Create("foo");

  Am_Object my_win =
      Am_Window.Create("my_win").Set(Am_WIDTH, 400).Set(Am_HEIGHT, 400);

  //Am_Object_Advanced my_adv_obj;
  Am_Object proto_rect = Am_Rectangle.Create()
                             .Set(Am_TOP, 10)
                             .Set(Am_LEFT, 10)
                             .Set(Am_WIDTH, 100)
                             .Set(Am_HEIGHT, 100)
                             .Add(MY_SLOT, 10);

  Am_Object_Advanced my_adv_obj = (Am_Object_Advanced &)proto_rect;

  // Here we will modify the demon set of my_adv_obj by first making
  // a copy of the old set and modifying it. The new demon set is then
  // placed back into the object.
  Am_Demon_Set my_demons(my_adv_obj.Get_Demons().Copy());

  // Here I set the creation demon. Note that the creation demon calls the
  // prototype creation demon too.

  Am_Object proto_obj = my_adv_obj.Get_Prototype();
  Am_Object_Advanced proto_obj_adv = (Am_Object_Advanced &)proto_obj;
  proto_create = proto_obj_adv.Get_Demons().Get_Object_Demon(Am_CREATE_OBJ);
  my_demons.Set_Object_Demon(Am_CREATE_OBJ, my_create_demon);

  // Here we install a slot demon that uses bit 5. The slot demon's semantics
  // are to activate when the slot changes value and only once per object.
  // Make sure that the demon set is local to the object (see above section).

  my_demons.Set_Slot_Demon(MY_BIT, my_slot_demon,
                           Am_DEMON_ON_CHANGE | Am_DEMON_PER_OBJECT);
  my_adv_obj.Set_Demons(my_demons);

  // Here we set a new bit to a slot. To make sure we do not turn off
  // previously set bits, we first get the old bits and bitwise-or the new one.
  //
  Am_Slot slot = my_adv_obj.Get_Slot(Am_TOP);
  unsigned short prev_bits = slot.Get_Demon_Bits();
  slot.Set_Demon_Bits(MY_BIT | prev_bits);
  if (prev_bits & MY_BIT)
    Am_Error("duplicate demon bit in slot\n");

  // Make the new slot demon bit default on.
  unsigned short default_bits = my_adv_obj.Get_Default_Demon_Bits();
  if (default_bits & MY_BIT)
    Am_Error("duplicate default demon bit\n");
  default_bits |= MY_BIT;
  my_adv_obj.Set_Default_Demon_Bits(default_bits);

  // Setting the demon mask
  unsigned short mask = my_adv_obj.Get_Demon_Mask();
  mask |= MY_BIT; // add the new demon bit.
  my_adv_obj.Set_Demon_Mask(mask);

  Am_Object my_rect = my_adv_obj.Create("my_rect");

  Am_Screen.Add_Part(my_win);

  Am_Object rect_2 =
      my_rect.Create("rect2").Set(Am_FILL_STYLE, Am_Red).Set(Am_LEFT, 30);

  Am_String my_str = "Foo is an object!";
  Foo.Add(MY_SLOT, my_str);

  ////////////////////////
  my_win.Add_Part(my_rect);
  my_win.Add_Part(rect_2);

  Am_Object my_inter = Am_Move_Grow_Interactor.Create("my_inter");

  my_win.Add_Part(my_inter);

  ////////////////////////
  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}